

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O3

Vec3fa __thiscall
embree::VelvetMaterial__eval
          (embree *this,ISPCVelvetMaterial *This,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,
          Vec3fa *wi)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vec3fa VVar12;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  uVar1 = *(undefined8 *)&(This->reflectance).field_0;
  uVar2 = *(undefined8 *)((long)&(This->reflectance).field_0 + 8);
  uVar3 = *(undefined8 *)&(This->horizonScatteringColor).field_0;
  uVar4 = *(undefined8 *)((long)&(This->horizonScatteringColor).field_0 + 8);
  fVar8 = This->horizonScatteringFallOff;
  fVar5 = (dg->Ns).field_0.m128[2] * (wi->field_0).m128[2] +
          (dg->Ns).field_0.m128[1] * (wi->field_0).m128[1] +
          (dg->Ns).field_0.m128[0] * (wi->field_0).m128[0];
  if (1.0 <= fVar5) {
    fVar5 = 1.0;
  }
  fVar11 = 0.0;
  if (0.0 <= fVar5) {
    fVar11 = fVar5;
  }
  fVar5 = (wi->field_0).m128[2] * (wo->field_0).m128[2] +
          (wi->field_0).m128[1] * (wo->field_0).m128[1] +
          (wi->field_0).m128[0] * (wo->field_0).m128[0];
  if (1.0 <= fVar5) {
    fVar5 = 1.0;
  }
  fVar7 = 0.0;
  if (0.0 <= fVar5) {
    fVar7 = fVar5;
  }
  fVar5 = powf(fVar7,This->backScattering);
  fVar6 = fVar5 * fVar11 * 0.31830987;
  local_48 = (float)uVar1;
  fStack_44 = (float)((ulong)uVar1 >> 0x20);
  fStack_40 = (float)uVar2;
  fStack_3c = (float)((ulong)uVar2 >> 0x20);
  fVar5 = (dg->Ns).field_0.m128[0];
  fVar11 = (dg->Ns).field_0.m128[1];
  fVar7 = (dg->Ns).field_0.m128[2];
  fVar9 = (wo->field_0).m128[2] * fVar7 +
          (wo->field_0).m128[1] * fVar11 + (wo->field_0).m128[0] * fVar5;
  if (1.0 <= fVar9) {
    fVar9 = 1.0;
  }
  fVar10 = 0.0;
  if (0.0 <= fVar9) {
    fVar10 = fVar9;
  }
  fVar5 = fVar7 * (wi->field_0).m128[2] +
          fVar11 * (wi->field_0).m128[1] + fVar5 * (wi->field_0).m128[0];
  if (1.0 <= fVar5) {
    fVar5 = 1.0;
  }
  fVar7 = 1.0 - fVar10 * fVar10;
  fVar11 = 0.0;
  if (0.0 <= fVar5) {
    fVar11 = fVar5;
  }
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar8 = powf(fVar7,fVar8);
  fVar8 = fVar8 * fVar11 * 0.31830987;
  local_38 = (float)uVar3;
  fStack_34 = (float)((ulong)uVar3 >> 0x20);
  fStack_30 = (float)uVar4;
  fStack_2c = (float)((ulong)uVar4 >> 0x20);
  VVar12.field_0._8_4_ = local_38 * fVar8;
  VVar12.field_0._12_4_ = fStack_34 * fVar8;
  VVar12.field_0._0_4_ = fVar6 * local_48 + VVar12.field_0._8_4_;
  VVar12.field_0._4_4_ = fVar6 * fStack_44 + VVar12.field_0._12_4_;
  *(float *)this = VVar12.field_0._0_4_;
  *(float *)(this + 4) = VVar12.field_0._4_4_;
  *(float *)(this + 8) = fVar6 * fStack_40 + fStack_30 * fVar8;
  *(float *)(this + 0xc) = fVar6 * fStack_3c + fStack_2c * fVar8;
  return (Vec3fa)VVar12.field_0;
}

Assistant:

Vec3fa VelvetMaterial__eval(ISPCVelvetMaterial* This, const BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Vec3fa& wi)
{
  Minneart minneart; Minneart__Constructor(&minneart,(Vec3fa)Vec3fa(This->reflectance),This->backScattering);
  Velvety velvety; Velvety__Constructor (&velvety,Vec3fa((Vec3fa)This->horizonScatteringColor),This->horizonScatteringFallOff);
  return Minneart__eval(&minneart,wo,dg,wi) + Velvety__eval(&velvety,wo,dg,wi);
}